

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modalgamepad.cpp
# Opt level: O3

void handleNubClick(NubClickMode mode,int value,Mouse *mouse,UinputDevice *gamepad,
                   Settings *settings)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  switch(mode) {
  case NUB_CLICK_LEFT:
    iVar1 = gamepad->_fd;
    if (iVar1 == 0) {
      return;
    }
    local_28._0_4_ = 0x13d0001;
    break;
  case NUB_CLICK_RIGHT:
    iVar1 = gamepad->_fd;
    if (iVar1 == 0) {
      return;
    }
    local_28._0_4_ = 0x13e0001;
    break;
  case MOUSE_LEFT:
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mouse->mutex);
    if (iVar1 != 0) {
LAB_0011cc4d:
      uVar2 = std::__throw_system_error(iVar1);
      pthread_mutex_unlock((pthread_mutex_t *)&mouse->mutex);
      _Unwind_Resume(uVar2);
    }
    iVar1 = (mouse->device)._fd;
    if (iVar1 != 0) {
      local_38 = 0;
      uStack_30 = 0;
      local_28 = CONCAT44(value,0x1100001);
      write(iVar1,&local_38,0x18);
      iVar1 = (mouse->device)._fd;
      if (iVar1 != 0) {
        local_38 = 0;
        uStack_30 = 0;
        local_28 = 0;
        write(iVar1,&local_38,0x18);
      }
    }
    goto LAB_0011cbf0;
  case MOUSE_RIGHT:
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mouse->mutex);
    if (iVar1 != 0) goto LAB_0011cc4d;
    iVar1 = (mouse->device)._fd;
    if (iVar1 != 0) {
      local_38 = 0;
      uStack_30 = 0;
      local_28 = CONCAT44(value,0x1110001);
      write(iVar1,&local_38,0x18);
      iVar1 = (mouse->device)._fd;
      if (iVar1 != 0) {
        local_38 = 0;
        uStack_30 = 0;
        local_28 = 0;
        write(iVar1,&local_38,0x18);
      }
    }
LAB_0011cbf0:
    pthread_mutex_unlock((pthread_mutex_t *)&mouse->mutex);
    return;
  default:
    goto switchD_0011cb15_default;
  }
  uStack_30 = 0;
  local_38 = 0;
  local_28 = CONCAT44(value,(undefined4)local_28);
  write(iVar1,&local_38,0x18);
  if (gamepad->_fd != 0) {
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    write(gamepad->_fd,&local_38,0x18);
  }
switchD_0011cb15_default:
  return;
}

Assistant:

void handleNubClick(Settings::NubClickMode mode, int value, Mouse* mouse, UinputDevice* gamepad, Settings const& settings)
{
  switch(mode)
  {
    case Settings::MOUSE_LEFT:
      {
        std::lock_guard<std::mutex> lk(mouse->mutex);
        mouse->device.send(EV_KEY, BTN_LEFT, value);
        mouse->device.send(EV_SYN, 0, 0);
        break;
      }
    case Settings::MOUSE_RIGHT:
      {
        std::lock_guard<std::mutex> lk(mouse->mutex);
        mouse->device.send(EV_KEY, BTN_RIGHT, value);
        mouse->device.send(EV_SYN, 0, 0);
        break;
      }
    case Settings::NUB_CLICK_LEFT:
      gamepad->send(EV_KEY, BTN_THUMBL, value);
      gamepad->send(EV_SYN, 0, 0);
      break;
    case Settings::NUB_CLICK_RIGHT:
      gamepad->send(EV_KEY, BTN_THUMBR, value);
      gamepad->send(EV_SYN, 0, 0);
      break;
  case Settings::UNKNOWN_NUB_CLICK_MODE:
      break;
  }
}